

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

void __thiscall
solitaire::Solitaire::tryAddPulledOutCardToHand
          (Solitaire *this,optional<solitaire::cards::Card> *card,SnapshotPtr *snapshot)

{
  MoveCardsOperationSnapshotCreator *pMVar1;
  Snapshot *pSVar2;
  Card *__x;
  pointer *__ptr;
  
  if ((card->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
      super__Optional_payload_base<solitaire::cards::Card>._M_engaged == true) {
    pMVar1 = (this->moveCardsOperationSnapshotCreator)._M_t.
             super___uniq_ptr_impl<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator,_std::default_delete<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator_*,_std::default_delete<solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator>_>
             .
             super__Head_base<0UL,_solitaire::archivers::interfaces::MoveCardsOperationSnapshotCreator_*,_false>
             ._M_head_impl;
    pSVar2 = (snapshot->_M_t).
             super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
             .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>.
             _M_head_impl;
    (snapshot->_M_t).
    super___uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::archivers::interfaces::Snapshot_*,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    .super__Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false>._M_head_impl =
         (Snapshot *)0x0;
    (*pMVar1->_vptr_MoveCardsOperationSnapshotCreator[3])();
    if (pSVar2 != (Snapshot *)0x0) {
      (*pSVar2->_vptr_Snapshot[1])();
    }
    __x = std::optional<solitaire::cards::Card>::value(card);
    std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::push_back
              (&this->cardsInHand,__x);
  }
  return;
}

Assistant:

void Solitaire::tryAddPulledOutCardToHand(
    const std::optional<Card>& card, SnapshotPtr snapshot)
{
    if (card) {
        moveCardsOperationSnapshotCreator->saveSourcePileSnapshot(std::move(snapshot));
        cardsInHand.push_back(card.value());
    }
}